

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexed_priority_queue.h
# Opt level: O2

key_type __thiscall
bk_lib::indexed_priority_queue<Clasp::SatElite::LessOccCost>::smaller_child
          (indexed_priority_queue<Clasp::SatElite::LessOccCost> *this,size_type n)

{
  ulong uVar1;
  pointer puVar2;
  bool bVar3;
  
  uVar1 = n * 2 + 2;
  if ((uVar1 < (this->heap_).ebo_.size) &&
     (puVar2 = (this->heap_).ebo_.buf,
     bVar3 = Clasp::SatElite::LessOccCost::operator()
                       (&this->compare_,(Var)puVar2[uVar1 & 0xffffffff],
                        *(Var *)((long)puVar2 + ((n * 2 & 0xffffffff) << 3 | 8))), bVar3)) {
    return uVar1;
  }
  return n * 2 | 1;
}

Assistant:

key_type smaller_child(size_type n) const {
		using namespace detail;
		return heap_right(n) < (key_type)heap_.size() && compare_(heap_[heap_right(n)], heap_[heap_left(n)])
			? heap_right(n)
			: heap_left(n);
	}